

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1604.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  pair<int,_int> *ppStack_138c0;
  int t_1;
  int t;
  int k;
  int j;
  int i;
  int sum;
  int n;
  pair<int,_int> p [10000];
  
  ppStack_138c0 = (pair<int,_int> *)&sum;
  do {
    std::pair<int,_int>::pair<int,_int,_true>(ppStack_138c0);
    ppStack_138c0 = ppStack_138c0 + 1;
  } while (ppStack_138c0 != p + 9999);
  std::istream::operator>>((istream *)&std::cin,&i);
  j = 0;
  for (k = 0; k < i; k = k + 1) {
    std::istream::operator>>((istream *)&std::cin,&p[(long)k + -1].second);
    j = p[(long)k + -1].second + j;
    (&sum)[(long)k * 2] = k + 1;
  }
  std::sort<std::pair<int,int>*,bool(*)(std::pair<int,int>,std::pair<int,int>)>
            ((pair<int,_int> *)&sum,(pair<int,_int> *)(&sum + (long)i * 2),comp);
  do {
    if (j == 0) {
      return 0;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sum);
    std::operator<<(poVar2," ");
    n = n + -1;
    if (p[0].second != 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p[0].first);
      std::operator<<(poVar2," ");
      p[0].second = p[0].second + -1;
    }
    t = 1;
    t_1 = 2;
    do {
      if (p[(long)t_1 + -1].second <= p[(long)t + -1].second) break;
      iVar1 = p[(long)t + -1].second;
      p[(long)t + -1].second = p[(long)t_1 + -1].second;
      p[(long)t_1 + -1].second = iVar1;
      iVar1 = (&sum)[(long)t * 2];
      (&sum)[(long)t * 2] = (&sum)[(long)t_1 * 2];
      (&sum)[(long)t_1 * 2] = iVar1;
      t_1 = t_1 + 1;
      t = t + 1;
    } while (t_1 != i);
    t = 0;
    t_1 = 1;
    do {
      if (p[(long)t_1 + -1].second <= p[(long)t + -1].second) break;
      iVar1 = p[(long)t + -1].second;
      p[(long)t + -1].second = p[(long)t_1 + -1].second;
      p[(long)t_1 + -1].second = iVar1;
      iVar1 = (&sum)[(long)t * 2];
      (&sum)[(long)t * 2] = (&sum)[(long)t_1 * 2];
      (&sum)[(long)t_1 * 2] = iVar1;
      t_1 = t_1 + 1;
      t = t + 1;
    } while (t_1 != i);
    j = j + -1;
    if (n < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    std::pair<int, int> p[10000];
    int n;
    std::cin >> n;
    int sum = 0;
    for (int i = 0; i < n; ++i) {
        std::cin >> p[i].second;
        sum += p[i].second;
        p[i].first = i + 1;
    }
    sort(p, p + n, comp);
    while (sum--) {
        std::cout << p[0].first << " ";
        p[0].second--;
        if (p[1].second != 0) {
            std::cout << p[1].first << " ";
            p[1].second--;
        }
        int j = 1, k = 2;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        j = 0, k = 1;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        if (p[0].second <= 0) {
            return 0;
        }
    }
    return 0;
}